

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,StackVar *sv)

{
  string_view sVar1;
  Type type_00;
  Enum index_00;
  bool bVar2;
  char __lhs;
  size_type sVar3;
  ulong uVar4;
  reference pvVar5;
  pointer ppVar6;
  string local_c0;
  string_view local_a0;
  string local_90;
  Type local_70;
  undefined1 local_68 [8];
  string name;
  _Self local_40;
  iterator iter;
  StackTypePair stp;
  Type local_24;
  Type type;
  Index index;
  StackVar *sv_local;
  CWriter *this_local;
  
  unique0x10000322 = sv;
  sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
  type.enum_ = ((int)sVar3 + -1) - stack0xffffffffffffffe8->index;
  local_24 = stack0xffffffffffffffe8->type;
  bVar2 = wabt::operator==(local_24,Any);
  if (bVar2) {
    uVar4 = (ulong)(uint)type.enum_;
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
    if (sVar3 <= uVar4) {
      __assert_fail("index < type_stack_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x4bd,"void wabt::(anonymous namespace)::CWriter::Write(const StackVar &)");
    }
    pvVar5 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                       (&this->type_stack_,(ulong)(uint)type.enum_);
    local_24.enum_ = pvVar5->enum_;
    local_24.type_index_ = pvVar5->type_index_;
  }
  std::pair<unsigned_int,_wabt::Type>::pair<unsigned_int_&,_wabt::Type_&,_true>
            ((pair<unsigned_int,_wabt::Type> *)&iter,(uint *)&type,&local_24);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->stack_var_sym_map_,(key_type *)&iter);
  name.field_2._8_8_ =
       std::
       map<std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->stack_var_sym_map_);
  bVar2 = std::operator==(&local_40,(_Self *)((long)&name.field_2 + 8));
  if (bVar2) {
    local_70 = local_24;
    __lhs = MangleType(local_24);
    std::__cxx11::to_string(&local_90,type.enum_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   __lhs,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    index_00 = type.enum_;
    type_00 = local_24;
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
    (anonymous_namespace)::CWriter::DefineStackVarName_abi_cxx11_
              (&local_c0,(CWriter *)this,index_00,type_00,sVar1);
    local_a0 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_c0);
    Write(this,local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)local_68);
  }
  else {
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_40);
    sVar1 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&ppVar6->second);
    Write(this,sVar1);
  }
  return;
}

Assistant:

void CWriter::Write(const StackVar& sv) {
  Index index = type_stack_.size() - 1 - sv.index;
  Type type = sv.type;
  if (type == Type::Any) {
    assert(index < type_stack_.size());
    type = type_stack_[index];
  }

  StackTypePair stp = {index, type};
  auto iter = stack_var_sym_map_.find(stp);
  if (iter == stack_var_sym_map_.end()) {
    std::string name = MangleType(type) + std::to_string(index);
    Write(DefineStackVarName(index, type, name));
  } else {
    Write(iter->second);
  }
}